

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_type.cpp
# Opt level: O3

profiler_settings_t * duckdb::MetricsUtils::GetPhaseTimingMetrics(void)

{
  _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *in_RDI;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  undefined8 local_10;
  
  local_10 = 0x1716151413121110;
  ::std::
  _Hashtable<duckdb::MetricsType,duckdb::MetricsType,std::allocator<duckdb::MetricsType>,std::__detail::_Identity,std::equal_to<duckdb::MetricsType>,duckdb::MetricsTypeHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<duckdb::MetricsType_const*>
            (in_RDI,&local_10,&stack0xfffffffffffffff8,0,&local_11,&local_12,&local_13);
  return (profiler_settings_t *)in_RDI;
}

Assistant:

profiler_settings_t MetricsUtils::GetPhaseTimingMetrics() {
    return {
        MetricsType::ALL_OPTIMIZERS,
        MetricsType::CUMULATIVE_OPTIMIZER_TIMING,
        MetricsType::PLANNER,
        MetricsType::PLANNER_BINDING,
        MetricsType::PHYSICAL_PLANNER,
        MetricsType::PHYSICAL_PLANNER_COLUMN_BINDING,
        MetricsType::PHYSICAL_PLANNER_RESOLVE_TYPES,
        MetricsType::PHYSICAL_PLANNER_CREATE_PLAN,
    };
}